

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableOpenContextMenu(int column_n)

{
  ImGuiTable *pIVar1;
  bool bVar2;
  ImGuiID id;
  ImGuiID context_menu_id;
  ImGuiTable *table;
  ImGuiContext *g;
  int column_n_local;
  
  pIVar1 = GImGui->CurrentTable;
  g._4_4_ = column_n;
  if ((column_n == -1) && (pIVar1->CurrentColumn != -1)) {
    g._4_4_ = pIVar1->CurrentColumn;
  }
  if (g._4_4_ == pIVar1->ColumnsCount) {
    g._4_4_ = -1;
  }
  bVar2 = false;
  if (-2 < g._4_4_) {
    bVar2 = g._4_4_ < pIVar1->ColumnsCount;
  }
  if (!bVar2) {
    __assert_fail("column_n >= -1 && column_n < table->ColumnsCount",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_tables.cpp"
                  ,0xbcc,"void ImGui::TableOpenContextMenu(int)");
  }
  if ((pIVar1->Flags & 7U) != 0) {
    pIVar1->IsContextPopupOpen = true;
    pIVar1->ContextPopupColumn = (ImGuiTableColumnIdx)g._4_4_;
    pIVar1->InstanceInteracted = pIVar1->InstanceCurrent;
    id = ImHashStr("##ContextMenu",0,pIVar1->ID);
    OpenPopupEx(id,0);
  }
  return;
}

Assistant:

void ImGui::TableOpenContextMenu(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (column_n == -1 && table->CurrentColumn != -1)   // When called within a column automatically use this one (for consistency)
        column_n = table->CurrentColumn;
    if (column_n == table->ColumnsCount)                // To facilitate using with TableGetHoveredColumn()
        column_n = -1;
    IM_ASSERT(column_n >= -1 && column_n < table->ColumnsCount);
    if (table->Flags & (ImGuiTableFlags_Resizable | ImGuiTableFlags_Reorderable | ImGuiTableFlags_Hideable))
    {
        table->IsContextPopupOpen = true;
        table->ContextPopupColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        OpenPopupEx(context_menu_id, ImGuiPopupFlags_None);
    }
}